

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int set_param_velocity(void)

{
  bool bVar1;
  bool bVar2;
  char id;
  int iVar3;
  double dVar4;
  double ff;
  int ff_changed;
  int ffl_changed;
  int ffr_changed;
  double ffl;
  double ffr;
  int j;
  
  if (g_param.device_version < 7) {
    bVar1 = false;
    bVar2 = false;
    iVar3 = ischanged_p(YP_PARAM_TORQUE_UNIT,MOTOR_RIGHT);
    if (((iVar3 != 0) || (iVar3 = ischanged_p(YP_PARAM_COUNT_REV,MOTOR_RIGHT), iVar3 != 0)) ||
       (iVar3 = ischanged_p(YP_PARAM_GEAR,MOTOR_RIGHT), iVar3 != 0)) {
      bVar1 = true;
    }
    dVar4 = (g_P[1][0] * 1608.495438637974) / (g_P[4][0] * ABS(g_P[9][0]));
    iVar3 = ischanged_p(YP_PARAM_GAIN_A,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar1)) {
      yprintf(OUTPUT_LV_DEBUG,"Info: GAIN_A: %d\n",(ulong)(uint)(int)(g_P[0x30][0] * dVar4));
      iVar3 = (int)(g_P[0x30][0] * dVar4);
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (iVar3 == 0) {
        yprintf(OUTPUT_LV_ERROR,"ERROR: GAIN_A fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR,"ERROR: Decrease TORQUE_FINENESS[%d]\n");
        return 0;
      }
      parameter_set('\b','\0',(long)(g_P[0x30][0] * dVar4));
    }
    iVar3 = ischanged_p(YP_PARAM_GAIN_C,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar1)) {
      parameter_set('\n','\0',(long)(g_P[0x32][0] * dVar4));
    }
    iVar3 = ischanged_p(YP_PARAM_GAIN_E,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar1)) {
      parameter_set('\f','\0',(long)(g_P[0x34][0] * dVar4));
    }
    iVar3 = ischanged_p(YP_PARAM_TORQUE_UNIT,MOTOR_LEFT);
    if (((iVar3 != 0) || (iVar3 = ischanged_p(YP_PARAM_COUNT_REV,MOTOR_LEFT), iVar3 != 0)) ||
       (iVar3 = ischanged_p(YP_PARAM_GEAR,MOTOR_LEFT), iVar3 != 0)) {
      bVar2 = true;
    }
    dVar4 = (g_P[1][1] * 1608.495438637974) / (g_P[4][1] * ABS(g_P[9][1]));
    iVar3 = ischanged_p(YP_PARAM_GAIN_B,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar2)) {
      yprintf(OUTPUT_LV_DEBUG,"Info: GAIN_B: %d\n",(ulong)(uint)(int)(g_P[0x30][0] * dVar4));
      iVar3 = (int)(g_P[0x31][0] * dVar4);
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (iVar3 == 0) {
        yprintf(OUTPUT_LV_ERROR,"ERROR: GAIN_B fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR,"ERROR: Decrease TORQUE_FINENESS[%d]\n",1);
        return 0;
      }
      parameter_set('\t','\0',(long)(g_P[0x31][0] * dVar4));
    }
    iVar3 = ischanged_p(YP_PARAM_GAIN_D,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar2)) {
      parameter_set('\v','\0',(long)(g_P[0x33][0] * dVar4));
    }
    iVar3 = ischanged_p(YP_PARAM_GAIN_F,MOTOR_RIGHT);
    if ((iVar3 != 0) || (bVar2)) {
      parameter_set('\r','\0',(long)(g_P[0x35][0] * dVar4));
    }
  }
  ffr._0_4_ = MOTOR_RIGHT;
  do {
    if (0xf < (int)ffr._0_4_) {
      for (ffr._0_4_ = 0; (int)ffr._0_4_ < 0x10; ffr._0_4_ = ffr._0_4_ + 1) {
        if (g_param.motor_enable[(int)ffr._0_4_] != 0) {
          parameter_set('A',(char)ffr._0_4_,(long)(g_P[0x46][(int)ffr._0_4_] * 1000.0));
        }
      }
      return 1;
    }
    if (g_param.motor_enable[(int)ffr._0_4_] != 0) {
      id = (char)ffr._0_4_;
      if (6 < g_param.device_version) {
        bVar1 = false;
        dVar4 = (g_P[1][(int)ffr._0_4_] * 1608.495438637974) /
                (g_P[4][(int)ffr._0_4_] * ABS(g_P[9][(int)ffr._0_4_]));
        iVar3 = ischanged_p(YP_PARAM_TORQUE_UNIT,ffr._0_4_);
        if (((iVar3 != 0) || (iVar3 = ischanged_p(YP_PARAM_COUNT_REV,ffr._0_4_), iVar3 != 0)) ||
           (iVar3 = ischanged_p(YP_PARAM_GEAR,ffr._0_4_), iVar3 != 0)) {
          bVar1 = true;
        }
        iVar3 = ischanged_p(YP_PARAM_INERTIA_SELF,ffr._0_4_);
        if ((iVar3 != 0) || (bVar1)) {
          yprintf(OUTPUT_LV_DEBUG,"Info: INERTIA_SELF[%d]: %d\n",(ulong)ffr._0_4_,
                  (ulong)(uint)(int)(g_P[0x3d][(int)ffr._0_4_] * dVar4));
          iVar3 = (int)(g_P[0x3d][(int)ffr._0_4_] * dVar4);
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 == 0) {
            yprintf(OUTPUT_LV_ERROR,"ERROR: INERTIA_SELF[%d] fixed point value underflow\n",
                    (ulong)ffr._0_4_);
            yprintf(OUTPUT_LV_ERROR,"ERROR: Decrease TORQUE_FINENESS[%d]\n",(ulong)ffr._0_4_);
            return 0;
          }
          parameter_set('\x1b',id,(long)(g_P[0x3d][(int)ffr._0_4_] * dVar4));
        }
        iVar3 = ischanged_p(YP_PARAM_INERTIA_CROSS,ffr._0_4_);
        if ((iVar3 != 0) || (bVar1)) {
          parameter_set('\x1c',id,(long)(g_P[0x3e][(int)ffr._0_4_] * dVar4));
        }
      }
      iVar3 = ischanged_p(YP_PARAM_GAIN_KP,ffr._0_4_);
      if (iVar3 != 0) {
        parameter_set('\x0e',id,(long)g_P[0x1e][(int)ffr._0_4_]);
      }
      iVar3 = ischanged_p(YP_PARAM_GAIN_KI,ffr._0_4_);
      if (iVar3 != 0) {
        parameter_set('\x0f',id,(long)g_P[0x1f][(int)ffr._0_4_]);
      }
      iVar3 = ischanged_p(YP_PARAM_INTEGRAL_MAX,ffr._0_4_);
      if (((iVar3 != 0) || (iVar3 = ischanged_p(YP_PARAM_COUNT_REV,ffr._0_4_), iVar3 != 0)) ||
         (iVar3 = ischanged_p(YP_PARAM_GEAR,ffr._0_4_), iVar3 != 0)) {
        parameter_set('\x14',id,
                      (long)(g_P[0x25][(int)ffr._0_4_] * g_P[4][(int)ffr._0_4_] *
                            ABS(g_P[9][(int)ffr._0_4_])));
        parameter_set('\x15',id,
                      (long)(-g_P[0x25][(int)ffr._0_4_] * g_P[4][(int)ffr._0_4_] *
                            ABS(g_P[9][(int)ffr._0_4_])));
      }
    }
    ffr._0_4_ = ffr._0_4_ + MOTOR_LEFT;
  } while( true );
}

Assistant:

int set_param_velocity(void)
{
  int j;

  if (g_param.device_version <= 6)
  {
    double ffr, ffl;
    int ffr_changed = 0, ffl_changed = 0;

    // Feed-forward dynamics compensation parameter
    // (torque [Nm]) = (wheel acc [rad/(s*s)]) * (wheel inertia [kgf*m*m])
    // (torque [toqcnt])
    //    = (wheel acc [cnt/(s*s)) * (TORQUE_UNIT [toqcnt/Nm] * (wheel inertia [kgf*m*m]) * (2 * pi) / ((COUNT_REV [cnt]) * (GEAR))
    // (acc-torque factor [toqcnt/(cnt/(s*s))])
    //    = (TORQUE_UNIT [toqcnt/Nm]) * (wheel inertia [kgf*m*m]) * (2 * pi) / ((COUNT_REV [cnt]) * (GEAR))

    if (ischanged_p(YP_PARAM_TORQUE_UNIT, 0) ||
        ischanged_p(YP_PARAM_COUNT_REV, 0) ||
        ischanged_p(YP_PARAM_GEAR, 0))
    {
      ffr_changed = 1;
    }
    ffr = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][0] / (g_P[YP_PARAM_COUNT_REV][0] * fabs(g_P[YP_PARAM_GEAR][0]));
    if (ischanged_p(YP_PARAM_GAIN_A, 0) || ffr_changed)
    {
      yprintf(OUTPUT_LV_DEBUG, "Info: GAIN_A: %d\n",
              (int)(g_P[YP_PARAM_GAIN_A][0] * ffr));
      if (abs(g_P[YP_PARAM_GAIN_A][0] * ffr) == 0)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: GAIN_A fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", 0);
        return 0;
      }
      parameter_set(PARAM_p_A, 0, g_P[YP_PARAM_GAIN_A][0] * ffr);
    }
    if (ischanged_p(YP_PARAM_GAIN_C, 0) || ffr_changed)
      parameter_set(PARAM_p_C, 0, g_P[YP_PARAM_GAIN_C][0] * ffr);
    if (ischanged_p(YP_PARAM_GAIN_E, 0) || ffr_changed)
      parameter_set(PARAM_p_E, 0, g_P[YP_PARAM_GAIN_E][0] * ffr);

    if (ischanged_p(YP_PARAM_TORQUE_UNIT, 1) ||
        ischanged_p(YP_PARAM_COUNT_REV, 1) ||
        ischanged_p(YP_PARAM_GEAR, 1))
    {
      ffl_changed = 1;
    }
    ffl = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][1] / (g_P[YP_PARAM_COUNT_REV][1] * fabs(g_P[YP_PARAM_GEAR][1]));
    if (ischanged_p(YP_PARAM_GAIN_B, 0) || ffl_changed)
    {
      yprintf(OUTPUT_LV_DEBUG, "Info: GAIN_B: %d\n",
              (int)(g_P[YP_PARAM_GAIN_A][0] * ffl));
      if (abs(g_P[YP_PARAM_GAIN_B][0] * ffl) == 0)
      {
        yprintf(OUTPUT_LV_ERROR, "ERROR: GAIN_B fixed point value underflow\n");
        yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", 1);
        return 0;
      }
      parameter_set(PARAM_p_B, 0, g_P[YP_PARAM_GAIN_B][0] * ffl);
    }
    if (ischanged_p(YP_PARAM_GAIN_D, 0) || ffl_changed)
      parameter_set(PARAM_p_D, 0, g_P[YP_PARAM_GAIN_D][0] * ffl);
    if (ischanged_p(YP_PARAM_GAIN_F, 0) || ffl_changed)
      parameter_set(PARAM_p_F, 0, g_P[YP_PARAM_GAIN_F][0] * ffl);
  }
  // PI制御のパラメータ
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    if (g_param.device_version > 6)
    {
      int ff_changed = 0;
      double ff = 256.0 * 2.0 * M_PI * g_P[YP_PARAM_TORQUE_UNIT][j] /
                  (g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
      if (ischanged_p(YP_PARAM_TORQUE_UNIT, j) ||
          ischanged_p(YP_PARAM_COUNT_REV, j) ||
          ischanged_p(YP_PARAM_GEAR, j))
      {
        ff_changed = 1;
      }
      if (ischanged_p(YP_PARAM_INERTIA_SELF, j) || ff_changed)
      {
        yprintf(OUTPUT_LV_DEBUG, "Info: INERTIA_SELF[%d]: %d\n", j,
                (int)(g_P[YP_PARAM_INERTIA_SELF][j] * ff));
        if (abs(g_P[YP_PARAM_INERTIA_SELF][j] * ff) == 0)
        {
          yprintf(OUTPUT_LV_ERROR, "ERROR: INERTIA_SELF[%d] fixed point value underflow\n", j);
          yprintf(OUTPUT_LV_ERROR, "ERROR: Decrease TORQUE_FINENESS[%d]\n", j);
          return 0;
        }
        parameter_set(PARAM_p_inertia_self, j, g_P[YP_PARAM_INERTIA_SELF][j] * ff);
      }
      if (ischanged_p(YP_PARAM_INERTIA_CROSS, j) || ff_changed)
      {
        parameter_set(PARAM_p_inertia_cross, j, g_P[YP_PARAM_INERTIA_CROSS][j] * ff);
      }
    }

    // [1/s]
    if (ischanged_p(YP_PARAM_GAIN_KP, j))
      parameter_set(PARAM_p_pi_kp, j, g_P[YP_PARAM_GAIN_KP][j]);
    // [1/s^2]
    if (ischanged_p(YP_PARAM_GAIN_KI, j))
      parameter_set(PARAM_p_pi_ki, j, g_P[YP_PARAM_GAIN_KI][j]);
    // 各種制限
    if (ischanged_p(YP_PARAM_INTEGRAL_MAX, j) ||
        ischanged_p(YP_PARAM_COUNT_REV, j) ||
        ischanged_p(YP_PARAM_GEAR, j))
    {
      parameter_set(PARAM_int_max, j,
                    g_P[YP_PARAM_INTEGRAL_MAX][j] * g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
      parameter_set(PARAM_int_min, j,
                    -g_P[YP_PARAM_INTEGRAL_MAX][j] * g_P[YP_PARAM_COUNT_REV][j] * fabs(g_P[YP_PARAM_GEAR][j]));
    }
  }

  // ウォッチドックタイマの設定
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;
    // [s] -> [ms]
    parameter_set(PARAM_watch_dog_limit, j, g_P[YP_PARAM_DEVICE_TIMEOUT][j] * 1000);
  }
  return 1;
}